

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyLoader.cpp
# Opt level: O2

void Assimp::PLYImporter::GetMaterialColor
               (vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                *avList,uint *aiPositions,EDataType *aiTypes,aiColor4D *clrOut)

{
  PropertyInstance *pPVar1;
  float fVar2;
  ai_real aVar3;
  
  if (clrOut != (aiColor4D *)0x0) {
    fVar2 = 0.0;
    if (*aiPositions != 0xffffffff) {
      pPVar1 = anon_unknown.dwarf_9529e6::GetProperty<Assimp::PLY::PropertyInstance>
                         (avList,*aiPositions);
      fVar2 = NormalizeColorValue(*(pPVar1->avList).
                                   super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                   ._M_impl.super__Vector_impl_data._M_start,*aiTypes);
    }
    aVar3 = 0.0;
    clrOut->r = fVar2;
    if (aiPositions[1] != 0xffffffff) {
      pPVar1 = anon_unknown.dwarf_9529e6::GetProperty<Assimp::PLY::PropertyInstance>
                         (avList,aiPositions[1]);
      aVar3 = NormalizeColorValue(*(pPVar1->avList).
                                   super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                   ._M_impl.super__Vector_impl_data._M_start,aiTypes[1]);
    }
    clrOut->g = aVar3;
    if (aiPositions[2] == 0xffffffff) {
      fVar2 = 0.0;
    }
    else {
      pPVar1 = anon_unknown.dwarf_9529e6::GetProperty<Assimp::PLY::PropertyInstance>
                         (avList,aiPositions[2]);
      fVar2 = NormalizeColorValue(*(pPVar1->avList).
                                   super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                   ._M_impl.super__Vector_impl_data._M_start,aiTypes[2]);
    }
    clrOut->b = fVar2;
    if (aiPositions[3] == 0xffffffff) {
      fVar2 = 1.0;
    }
    else {
      pPVar1 = anon_unknown.dwarf_9529e6::GetProperty<Assimp::PLY::PropertyInstance>
                         (avList,aiPositions[3]);
      fVar2 = NormalizeColorValue(*(pPVar1->avList).
                                   super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                   ._M_impl.super__Vector_impl_data._M_start,aiTypes[3]);
    }
    clrOut->a = fVar2;
    return;
  }
  __assert_fail("__null != clrOut",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Ply/PlyLoader.cpp"
                ,0x2b2,
                "static void Assimp::PLYImporter::GetMaterialColor(const std::vector<PLY::PropertyInstance> &, unsigned int *, PLY::EDataType *, aiColor4D *)"
               );
}

Assistant:

void PLYImporter::GetMaterialColor(const std::vector<PLY::PropertyInstance>& avList,
  unsigned int aiPositions[4],
  PLY::EDataType aiTypes[4],
  aiColor4D* clrOut)
{
  ai_assert(NULL != clrOut);

  if (0xFFFFFFFF == aiPositions[0])clrOut->r = 0.0f;
  else
  {
    clrOut->r = NormalizeColorValue(GetProperty(avList,
      aiPositions[0]).avList.front(), aiTypes[0]);
  }

  if (0xFFFFFFFF == aiPositions[1])clrOut->g = 0.0f;
  else
  {
    clrOut->g = NormalizeColorValue(GetProperty(avList,
      aiPositions[1]).avList.front(), aiTypes[1]);
  }

  if (0xFFFFFFFF == aiPositions[2])clrOut->b = 0.0f;
  else
  {
    clrOut->b = NormalizeColorValue(GetProperty(avList,
      aiPositions[2]).avList.front(), aiTypes[2]);
  }

  // assume 1.0 for the alpha channel ifit is not set
  if (0xFFFFFFFF == aiPositions[3])clrOut->a = 1.0f;
  else
  {
    clrOut->a = NormalizeColorValue(GetProperty(avList,
      aiPositions[3]).avList.front(), aiTypes[3]);
  }
}